

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogText(char *fmt,...)

{
  ImGuiContext *in_RCX;
  char *in_RDX;
  __va_list_tag *in_RSI;
  va_list args;
  ImGuiContext *g;
  
  if ((GImGui->LogEnabled & 1U) != 0) {
    ::LogTextV(in_RCX,in_RDX,in_RSI);
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    LogTextV(g, fmt, args);
    va_end(args);
}